

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteSInt32
               (int field_number,int32_t value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  byte *ptr;
  
  uVar4 = field_number << 3;
  pbVar3 = output->cur_;
  if ((output->impl_).end_ <= pbVar3) {
    pbVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar3);
  }
  output->cur_ = pbVar3;
  *pbVar3 = (byte)uVar4;
  if (uVar4 < 0x80) {
    ptr = pbVar3 + 1;
  }
  else {
    *pbVar3 = (byte)uVar4 | 0x80;
    pbVar3[1] = (byte)(uVar4 >> 7);
    ptr = pbVar3 + 2;
    if (0x3fff < uVar4) {
      uVar2 = (uint)pbVar3[1];
      uVar4 = uVar4 >> 7;
      do {
        ptr[-1] = (byte)uVar2 | 0x80;
        uVar2 = uVar4 >> 7;
        *ptr = (byte)uVar2;
        ptr = ptr + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar2;
      } while (bVar1);
    }
  }
  output->cur_ = ptr;
  uVar4 = value >> 0x1f ^ value * 2;
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  output->cur_ = ptr;
  *ptr = (byte)uVar4;
  if (uVar4 < 0x80) {
    pbVar3 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar4 | 0x80;
    ptr[1] = (byte)(uVar4 >> 7);
    pbVar3 = ptr + 2;
    if (0x3fff < uVar4) {
      uVar2 = (uint)ptr[1];
      uVar4 = uVar4 >> 7;
      do {
        pbVar3[-1] = (byte)uVar2 | 0x80;
        uVar2 = uVar4 >> 7;
        *pbVar3 = (byte)uVar2;
        pbVar3 = pbVar3 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar2;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar3;
  return;
}

Assistant:

void WireFormatLite::WriteSInt32(int field_number, int32_t value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt32NoTag(value, output);
}